

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RegularExpression.cxx
# Opt level: O0

bool __thiscall cmsys::RegularExpression::compile(RegularExpression *this,char *exp)

{
  char *pcVar1;
  size_t sVar2;
  uint local_3c;
  size_t sStack_38;
  int flags;
  size_t len;
  char *longest;
  char *scan;
  char *exp_local;
  RegularExpression *this_local;
  
  scan = exp;
  exp_local = (char *)this;
  if (exp == (char *)0x0) {
    printf("RegularExpression::compile(): No expression supplied.\n");
    this_local._7_1_ = false;
  }
  else {
    regnpar = 1;
    regsize = 0;
    regcode = &regdummy;
    regparse = exp;
    regc(-100);
    pcVar1 = reg(0,(int *)&local_3c);
    if (pcVar1 == (char *)0x0) {
      printf("RegularExpression::compile(): Error in compile.\n");
      this_local._7_1_ = false;
    }
    else {
      this->searchstring = (char *)0x0;
      this->endp[0] = (char *)0x0;
      this->startp[0] = (char *)0x0;
      if ((long)regsize < 0x7fff) {
        if ((this->program != (char *)0x0) && (this->program != (char *)0x0)) {
          operator_delete__(this->program);
        }
        pcVar1 = (char *)operator_new__(regsize);
        this->program = pcVar1;
        this->progsize = (int)regsize;
        if (this->program == (char *)0x0) {
          printf("RegularExpression::compile(): Out of memory.\n");
          this_local._7_1_ = false;
        }
        else {
          regparse = scan;
          regnpar = 1;
          regcode = this->program;
          regc(-100);
          reg(0,(int *)&local_3c);
          this->regstart = '\0';
          this->reganch = '\0';
          this->regmust = (char *)0x0;
          this->regmlen = 0;
          longest = this->program + 1;
          pcVar1 = regnext(longest);
          if (*pcVar1 == '\0') {
            pcVar1 = longest + 3;
            if (*pcVar1 == '\b') {
              this->regstart = longest[6];
            }
            else if (*pcVar1 == '\x01') {
              this->reganch = this->reganch + '\x01';
            }
            if ((local_3c & 4) != 0) {
              len = 0;
              sStack_38 = 0;
              for (longest = pcVar1; longest != (char *)0x0; longest = regnext(longest)) {
                if ((*longest == '\b') && (sVar2 = strlen(longest + 3), sStack_38 <= sVar2)) {
                  len = (size_t)(longest + 3);
                  sStack_38 = strlen(longest + 3);
                }
              }
              this->regmust = (char *)len;
              this->regmlen = sStack_38;
            }
          }
          this_local._7_1_ = true;
        }
      }
      else {
        printf("RegularExpression::compile(): Expression too big.\n");
        this_local._7_1_ = false;
      }
    }
  }
  return this_local._7_1_;
}

Assistant:

bool RegularExpression::compile (const char* exp) {
    const char* scan;
    const char* longest;
    size_t      len;
    int         flags;

    if (exp == 0) {
      //RAISE Error, SYM(RegularExpression), SYM(No_Expr),
      printf ("RegularExpression::compile(): No expression supplied.\n");
      return false;
    }

    // First pass: determine size, legality.
    regparse = exp;
    regnpar = 1;
    regsize = 0L;
    regcode = &regdummy;
    regc(static_cast<char>(MAGIC));
    if(!reg(0, &flags))
      {
        printf ("RegularExpression::compile(): Error in compile.\n");
        return false;
      }
    this->startp[0] = this->endp[0] = this->searchstring = 0;

    // Small enough for pointer-storage convention?
    if (regsize >= 32767L) {    // Probably could be 65535L.
      //RAISE Error, SYM(RegularExpression), SYM(Expr_Too_Big),
      printf ("RegularExpression::compile(): Expression too big.\n");
      return false;
    }

    // Allocate space.
//#ifndef WIN32
    if (this->program != 0) delete [] this->program;
//#endif
    this->program = new char[regsize];
    this->progsize = static_cast<int>(regsize);

    if (this->program == 0) {
      //RAISE Error, SYM(RegularExpression), SYM(Out_Of_Memory),
      printf ("RegularExpression::compile(): Out of memory.\n");
      return false;
    }

    // Second pass: emit code.
    regparse = exp;
    regnpar = 1;
    regcode = this->program;
    regc(static_cast<char>(MAGIC));
    reg(0, &flags);

    // Dig out information for optimizations.
    this->regstart = '\0';              // Worst-case defaults.
    this->reganch = 0;
    this->regmust = 0;
    this->regmlen = 0;
    scan = this->program + 1;   // First BRANCH.
    if (OP(regnext(scan)) == END) {     // Only one top-level choice.
        scan = OPERAND(scan);

        // Starting-point info.
        if (OP(scan) == EXACTLY)
            this->regstart = *OPERAND(scan);
        else if (OP(scan) == BOL)
            this->reganch++;

         //
         // If there's something expensive in the r.e., find the longest
         // literal string that must appear and make it the regmust.  Resolve
         // ties in favor of later strings, since the regstart check works
         // with the beginning of the r.e. and avoiding duplication
         // strengthens checking.  Not a strong reason, but sufficient in the
         // absence of others.
         //
        if (flags & SPSTART) {
            longest = 0;
            len = 0;
            for (; scan != 0; scan = regnext(scan))
                if (OP(scan) == EXACTLY && strlen(OPERAND(scan)) >= len) {
                    longest = OPERAND(scan);
                    len = strlen(OPERAND(scan));
                }
            this->regmust = longest;
            this->regmlen = len;
        }
    }
    return true;
}